

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
CP::priority_queue<int,_bool_(*)(const_int_&,_const_int_&)>::fixDown
          (priority_queue<int,_bool_(*)(const_int_&,_const_int_&)> *this,size_t idx)

{
  bool bVar1;
  long lVar2;
  ulong local_28;
  size_t c;
  size_t sStack_18;
  int tmp;
  size_t idx_local;
  priority_queue<int,_bool_(*)(const_int_&,_const_int_&)> *this_local;
  
  c._4_4_ = this->mData[idx];
  sStack_18 = idx;
  idx_local = (size_t)this;
  while( true ) {
    lVar2 = sStack_18 * 2;
    local_28 = lVar2 + 1;
    if (this->mSize <= local_28) break;
    if ((lVar2 + 2U < this->mSize) &&
       (bVar1 = (*this->mLess)(this->mData + local_28,this->mData + lVar2 + 2), bVar1)) {
      local_28 = lVar2 + 2;
    }
    bVar1 = (*this->mLess)(this->mData + local_28,(int *)((long)&c + 4));
    if (bVar1) break;
    this->mData[sStack_18] = this->mData[local_28];
    sStack_18 = local_28;
  }
  this->mData[sStack_18] = c._4_4_;
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }